

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O3

void __thiscall AReceiver::Handler(AReceiver *this,Event *ev)

{
  Type TVar1;
  ostream *poVar2;
  UserEvent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *msg;
  
  TVar1 = Event::GetType(ev);
  if (TVar1 == 2) {
    poVar2 = (ostream *)&std::cout;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[A] END",7);
  }
  else {
    if (TVar1 != 0) {
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[A] START: ",0xb);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)ev[1]._vptr_Event,*(long *)&ev[1].type);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return;
}

Assistant:

void Handler(Event *ev) {
            switch(ev->GetType()) {
                case Actions::A_STARTED: {
                    UserEvent<std::string> *msg = static_cast<UserEvent<std::string> *>(ev);
                    std::cout << "[A] START: " << msg->GetObject() << std::endl;
                } break;

                case Actions::A_ENDED: {
                    std::cout << "[A] END" << std::endl;
                } break;
            }
        }